

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamBufImpl<Catch::OutputDebugWriter,_256UL>::sync
          (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this)

{
  string local_30;
  
  if (*(long *)&(this->super_StreamBufBase).field_0x20 !=
      *(long *)&(this->super_StreamBufBase).field_0x28) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30);
    writeToDebugConsole(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    *(undefined8 *)&(this->super_StreamBufBase).field_0x28 =
         *(undefined8 *)&(this->super_StreamBufBase).field_0x20;
  }
  return;
}

Assistant:

bool operator !() const { return m_p == CATCH_NULL; }